

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O3

void __thiscall vkb::SystemInfo::SystemInfo(SystemInfo *this)

{
  pointer pVVar1;
  pointer pVVar2;
  undefined1 auVar3 [16];
  undefined *__s2;
  VkResult VVar4;
  int iVar5;
  VkExtensionProperties *ext;
  pointer pVVar6;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *__range3;
  VkLayerProperties *layer;
  pointer pVVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> layer_extensions;
  undefined1 local_78 [16];
  pointer local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  (this->available_extensions).
  super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->available_extensions).
  super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->available_layers).
    super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  (this->available_layers).super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->available_layers).super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->validation_layers_available = false;
  this->debug_utils_available = false;
  this->instance_api_version = 0x400000;
  VVar4 = detail::get_vector<VkLayerProperties,VkResult(*&)(unsigned_int*,VkLayerProperties*)>
                    (&this->available_layers,
                     (_func_VkResult_uint_ptr_VkLayerProperties_ptr **)
                     (detail::vulkan_functions()::v + 0x48));
  __s2 = detail::validation_layer_name;
  pVVar7 = (this->available_layers).
           super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar1 = (this->available_layers).
           super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (VVar4 == VK_SUCCESS) {
    for (; pVVar7 != pVVar1; pVVar7 = pVVar7 + 1) {
      iVar5 = strcmp(pVVar7->layerName,__s2);
      if (iVar5 == 0) {
        this->validation_layers_available = true;
      }
    }
  }
  else if (pVVar1 != pVVar7) {
    (this->available_layers).
    super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar7;
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_78._8_8_;
  local_78 = auVar3 << 0x40;
  VVar4 = detail::
          get_vector<VkExtensionProperties,VkResult(*&)(char_const*,unsigned_int*,VkExtensionProperties*),decltype(nullptr)>
                    (&this->available_extensions,
                     (_func_VkResult_char_ptr_uint_ptr_VkExtensionProperties_ptr **)
                     (detail::vulkan_functions()::v + 0x40),(void **)local_78);
  pVVar6 = (this->available_extensions).
           super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl
           .super__Vector_impl_data._M_start;
  pVVar2 = (this->available_extensions).
           super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (VVar4 == VK_SUCCESS) {
    for (; pVVar6 != pVVar2; pVVar6 = pVVar6 + 1) {
      auVar10[0] = -(pVVar6->extensionName[0] == 'V');
      auVar10[1] = -(pVVar6->extensionName[1] == 'K');
      auVar10[2] = -(pVVar6->extensionName[2] == '_');
      auVar10[3] = -(pVVar6->extensionName[3] == 'E');
      auVar10[4] = -(pVVar6->extensionName[4] == 'X');
      auVar10[5] = -(pVVar6->extensionName[5] == 'T');
      auVar10[6] = -(pVVar6->extensionName[6] == '_');
      auVar10[7] = -(pVVar6->extensionName[7] == 'd');
      auVar10[8] = -(pVVar6->extensionName[8] == 'e');
      auVar10[9] = -(pVVar6->extensionName[9] == 'b');
      auVar10[10] = -(pVVar6->extensionName[10] == 'u');
      auVar10[0xb] = -(pVVar6->extensionName[0xb] == 'g');
      auVar10[0xc] = -(pVVar6->extensionName[0xc] == '_');
      auVar10[0xd] = -(pVVar6->extensionName[0xd] == 'u');
      auVar10[0xe] = -(pVVar6->extensionName[0xe] == 't');
      auVar10[0xf] = -(pVVar6->extensionName[0xf] == 'i');
      auVar11[0] = -(pVVar6->extensionName[3] == 'E');
      auVar11[1] = -(pVVar6->extensionName[4] == 'X');
      auVar11[2] = -(pVVar6->extensionName[5] == 'T');
      auVar11[3] = -(pVVar6->extensionName[6] == '_');
      auVar11[4] = -(pVVar6->extensionName[7] == 'd');
      auVar11[5] = -(pVVar6->extensionName[8] == 'e');
      auVar11[6] = -(pVVar6->extensionName[9] == 'b');
      auVar11[7] = -(pVVar6->extensionName[10] == 'u');
      auVar11[8] = -(pVVar6->extensionName[0xb] == 'g');
      auVar11[9] = -(pVVar6->extensionName[0xc] == '_');
      auVar11[10] = -(pVVar6->extensionName[0xd] == 'u');
      auVar11[0xb] = -(pVVar6->extensionName[0xe] == 't');
      auVar11[0xc] = -(pVVar6->extensionName[0xf] == 'i');
      auVar11[0xd] = -(pVVar6->extensionName[0x10] == 'l');
      auVar11[0xe] = -(pVVar6->extensionName[0x11] == 's');
      auVar11[0xf] = -(pVVar6->extensionName[0x12] == '\0');
      auVar11 = auVar11 & auVar10;
      if ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar11[0xf] >> 7) << 0xf) == 0xffff) {
        this->debug_utils_available = true;
      }
    }
  }
  else if (pVVar2 != pVVar6) {
    (this->available_extensions).
    super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar6;
  }
  pVVar7 = (this->available_layers).
           super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar1 = (this->available_layers).
           super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pVVar7 != pVVar1) {
    local_48 = 0x645f5458455f4b56;
    uStack_40 = 0x6974755f67756265;
    local_58 = 0x756265645f545845;
    uStack_50 = 0x736c6974755f67;
    do {
      local_78 = (undefined1  [16])0x0;
      local_68 = (pointer)0x0;
      VVar4 = detail::
              get_vector<VkExtensionProperties,VkResult(*&)(char_const*,unsigned_int*,VkExtensionProperties*),char(&)[256]>
                        ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
                         local_78,(_func_VkResult_char_ptr_uint_ptr_VkExtensionProperties_ptr **)
                                  (detail::vulkan_functions()::v + 0x40),pVVar7->layerName);
      if (VVar4 == VK_SUCCESS) {
        std::vector<VkExtensionProperties,std::allocator<VkExtensionProperties>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<VkExtensionProperties*,std::vector<VkExtensionProperties,std::allocator<VkExtensionProperties>>>>
                  ((vector<VkExtensionProperties,std::allocator<VkExtensionProperties>> *)
                   &this->available_extensions,
                   (this->available_extensions).
                   super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                   ._M_impl.super__Vector_impl_data._M_finish,local_78._0_8_,local_78._8_8_);
        for (pVVar6 = (pointer)local_78._0_8_; pVVar6 != (pointer)local_78._8_8_;
            pVVar6 = pVVar6 + 1) {
          auVar8[0] = -(pVVar6->extensionName[0] == (char)local_48);
          auVar8[1] = -(pVVar6->extensionName[1] == local_48._1_1_);
          auVar8[2] = -(pVVar6->extensionName[2] == local_48._2_1_);
          auVar8[3] = -(pVVar6->extensionName[3] == local_48._3_1_);
          auVar8[4] = -(pVVar6->extensionName[4] == local_48._4_1_);
          auVar8[5] = -(pVVar6->extensionName[5] == local_48._5_1_);
          auVar8[6] = -(pVVar6->extensionName[6] == local_48._6_1_);
          auVar8[7] = -(pVVar6->extensionName[7] == local_48._7_1_);
          auVar8[8] = -(pVVar6->extensionName[8] == (char)uStack_40);
          auVar8[9] = -(pVVar6->extensionName[9] == uStack_40._1_1_);
          auVar8[10] = -(pVVar6->extensionName[10] == uStack_40._2_1_);
          auVar8[0xb] = -(pVVar6->extensionName[0xb] == uStack_40._3_1_);
          auVar8[0xc] = -(pVVar6->extensionName[0xc] == uStack_40._4_1_);
          auVar8[0xd] = -(pVVar6->extensionName[0xd] == uStack_40._5_1_);
          auVar8[0xe] = -(pVVar6->extensionName[0xe] == uStack_40._6_1_);
          auVar8[0xf] = -(pVVar6->extensionName[0xf] == uStack_40._7_1_);
          auVar9[0] = -(pVVar6->extensionName[3] == (char)local_58);
          auVar9[1] = -(pVVar6->extensionName[4] == local_58._1_1_);
          auVar9[2] = -(pVVar6->extensionName[5] == local_58._2_1_);
          auVar9[3] = -(pVVar6->extensionName[6] == local_58._3_1_);
          auVar9[4] = -(pVVar6->extensionName[7] == local_58._4_1_);
          auVar9[5] = -(pVVar6->extensionName[8] == local_58._5_1_);
          auVar9[6] = -(pVVar6->extensionName[9] == local_58._6_1_);
          auVar9[7] = -(pVVar6->extensionName[10] == local_58._7_1_);
          auVar9[8] = -(pVVar6->extensionName[0xb] == (char)uStack_50);
          auVar9[9] = -(pVVar6->extensionName[0xc] == uStack_50._1_1_);
          auVar9[10] = -(pVVar6->extensionName[0xd] == uStack_50._2_1_);
          auVar9[0xb] = -(pVVar6->extensionName[0xe] == uStack_50._3_1_);
          auVar9[0xc] = -(pVVar6->extensionName[0xf] == uStack_50._4_1_);
          auVar9[0xd] = -(pVVar6->extensionName[0x10] == uStack_50._5_1_);
          auVar9[0xe] = -(pVVar6->extensionName[0x11] == uStack_50._6_1_);
          auVar9[0xf] = -(pVVar6->extensionName[0x12] == uStack_50._7_1_);
          auVar9 = auVar9 & auVar8;
          if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) == 0xffff) {
            this->debug_utils_available = true;
          }
        }
      }
      if ((pointer)local_78._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_78._0_8_,(long)local_68 - local_78._0_8_);
      }
      pVVar7 = pVVar7 + 1;
    } while (pVVar7 != pVVar1);
  }
  if (detail::vulkan_functions()::v._80_8_ != 0) {
    iVar5 = (*(code *)detail::vulkan_functions()::v._80_8_)(&this->instance_api_version);
    if (iVar5 != 0) {
      this->instance_api_version = 0x400000;
    }
  }
  return;
}

Assistant:

SystemInfo::SystemInfo() {
    auto available_layers_ret = detail::get_vector<VkLayerProperties>(
        this->available_layers, detail::vulkan_functions().fp_vkEnumerateInstanceLayerProperties);
    if (available_layers_ret != VK_SUCCESS) {
        this->available_layers.clear();
    }

    for (auto& layer : this->available_layers)
        if (strcmp(layer.layerName, detail::validation_layer_name) == 0) validation_layers_available = true;

    auto available_extensions_ret = detail::get_vector<VkExtensionProperties>(
        this->available_extensions, detail::vulkan_functions().fp_vkEnumerateInstanceExtensionProperties, nullptr);
    if (available_extensions_ret != VK_SUCCESS) {
        this->available_extensions.clear();
    }

    for (auto& ext : this->available_extensions) {
        if (strcmp(ext.extensionName, VK_EXT_DEBUG_UTILS_EXTENSION_NAME) == 0) {
            debug_utils_available = true;
        }
    }

    for (auto& layer : this->available_layers) {
        std::vector<VkExtensionProperties> layer_extensions;
        auto layer_extensions_ret = detail::get_vector<VkExtensionProperties>(
            layer_extensions, detail::vulkan_functions().fp_vkEnumerateInstanceExtensionProperties, layer.layerName);
        if (layer_extensions_ret == VK_SUCCESS) {
            this->available_extensions.insert(
                this->available_extensions.end(), layer_extensions.begin(), layer_extensions.end());
            for (auto& ext : layer_extensions) {
                if (strcmp(ext.extensionName, VK_EXT_DEBUG_UTILS_EXTENSION_NAME) == 0) {
                    debug_utils_available = true;
                }
            }
        }
    }

    PFN_vkEnumerateInstanceVersion pfn_vkEnumerateInstanceVersion = detail::vulkan_functions().fp_vkEnumerateInstanceVersion;

    if (pfn_vkEnumerateInstanceVersion != nullptr) {
        VkResult res = pfn_vkEnumerateInstanceVersion(&instance_api_version);
        if (res != VK_SUCCESS) {
            instance_api_version = VKB_VK_API_VERSION_1_0;
        }
    }
}